

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::_OnChangedVtxOffset(ImDrawList *this)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ImDrawCmd IStack_38;
  
  this->_VtxCurrentIdx = 0;
  IStack_38.UserCallbackData = (this->CmdBuffer).Data;
  lVar2 = (long)(this->CmdBuffer).Size;
  if (((ImDrawCmd *)((long)IStack_38.UserCallbackData + (lVar2 + -1) * 0x38))->ElemCount != 0) {
    IStack_38.UserCallbackData = (void *)0x0;
    IStack_38.ElemCount = 0;
    IStack_38._36_4_ = 0;
    IStack_38.UserCallback = (ImDrawCallback)0x0;
    IStack_38.ClipRect.x = (this->_CmdHeader).ClipRect.x;
    IStack_38.ClipRect.y = (this->_CmdHeader).ClipRect.y;
    IStack_38.ClipRect.z = (this->_CmdHeader).ClipRect.z;
    IStack_38.ClipRect.w = (this->_CmdHeader).ClipRect.w;
    IStack_38.TextureId = (this->_CmdHeader).TextureId;
    IStack_38.VtxOffset = (this->_CmdHeader).VtxOffset;
    IStack_38.IdxOffset = (this->IdxBuffer).Size;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = IStack_38.ClipRect._0_8_;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = IStack_38.ClipRect._8_8_;
    auVar3 = vcmpps_avx(auVar3,auVar4,2);
    auVar1 = vshufps_avx(auVar3,auVar3,0x50);
    auVar3 = vpcmpeqd_avx(auVar4,auVar4);
    if (((auVar3 & ~auVar1) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
        -1 < SUB161(auVar3 & ~auVar1,0xf)) {
      ImVector<ImDrawCmd>::push_back(&this->CmdBuffer,&IStack_38);
      return;
    }
    __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x1c1,"void ImDrawList::AddDrawCmd()");
  }
  IStack_38.UserCallbackData = (void *)((long)IStack_38.UserCallbackData + lVar2 * 0x38);
  if (((ImDrawCmd *)((long)IStack_38.UserCallbackData + -0x38))->UserCallback == (ImDrawCallback)0x0
     ) {
    ((ImDrawCmd *)((long)IStack_38.UserCallbackData + -0x38))->VtxOffset =
         (this->_CmdHeader).VtxOffset;
    return;
  }
  IStack_38.UserCallback = _CalcCircleAutoSegmentCount;
  __assert_fail("curr_cmd->UserCallback == __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                ,0x21d,"void ImDrawList::_OnChangedVtxOffset()");
}

Assistant:

void ImDrawList::_OnChangedVtxOffset()
{
    // We don't need to compare curr_cmd->VtxOffset != _CmdHeader.VtxOffset because we know it'll be different at the time we call this.
    _VtxCurrentIdx = 0;
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    //IM_ASSERT(curr_cmd->VtxOffset != _CmdHeader.VtxOffset); // See #3349
    if (curr_cmd->ElemCount != 0)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);
    curr_cmd->VtxOffset = _CmdHeader.VtxOffset;
}